

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_sse4.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_y_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  int16_t *piVar1;
  undefined2 *puVar2;
  undefined1 (*pauVar3) [16];
  ushort *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  CONV_BUF_TYPE *pCVar8;
  char cVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined2 uVar24;
  undefined2 uVar25;
  undefined2 uVar26;
  undefined2 uVar27;
  undefined2 uVar28;
  undefined2 uVar29;
  undefined2 uVar30;
  undefined2 uVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  CONV_BUF_TYPE *pCVar39;
  uint16_t *puVar40;
  uint16_t *puVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  uint uVar46;
  uint16_t *puVar47;
  long lVar48;
  uint16_t *puVar49;
  int iVar50;
  CONV_BUF_TYPE *pCVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar57;
  int iVar58;
  short sVar64;
  short sVar65;
  int iVar66;
  short sVar67;
  undefined2 uVar68;
  int iVar69;
  undefined2 uVar71;
  undefined1 auVar59 [16];
  undefined2 uVar70;
  undefined2 uVar73;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar72;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int iVar76;
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  short sVar83;
  int iVar84;
  short sVar89;
  int iVar90;
  int iVar92;
  undefined1 auVar85 [16];
  int iVar93;
  undefined1 auVar86 [16];
  short sVar88;
  short sVar91;
  undefined1 auVar87 [16];
  short sVar94;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  short sVar103;
  int iVar104;
  int iVar109;
  undefined2 uVar110;
  int iVar111;
  undefined2 uVar112;
  undefined2 uVar113;
  undefined2 uVar115;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  int iVar114;
  undefined1 auVar108 [16];
  int iVar116;
  int iVar121;
  int iVar122;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  int iVar123;
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined2 uVar126;
  undefined2 uVar127;
  undefined2 uVar128;
  undefined2 uVar129;
  undefined2 uVar130;
  undefined2 uVar131;
  undefined2 uVar132;
  undefined2 uVar133;
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 local_268 [16];
  undefined1 local_248 [16];
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 uStack_210;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  short local_128;
  short sStack_126;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  
  iVar43 = conv_params->round_1 + conv_params->round_0;
  cVar9 = (char)bd - (char)iVar43;
  iVar50 = 7 - conv_params->round_0;
  iVar36 = (1 << (cVar9 + 0xdU & 0x1f)) + (1 << (cVar9 + 0xeU & 0x1f));
  uVar34 = 0xe - iVar43;
  lVar42 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
  uVar46 = 0xff;
  if (bd == 0xc) {
    uVar46 = 0xfff;
  }
  uVar33 = 0x3ff;
  if (bd != 10) {
    uVar33 = uVar46;
  }
  piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)filter_params_y->taps;
  uVar10 = *(undefined4 *)piVar1;
  uVar11 = *(undefined4 *)(piVar1 + 2);
  uVar12 = *(undefined4 *)(piVar1 + 4);
  uVar13 = *(undefined4 *)(piVar1 + 6);
  pCVar8 = conv_params->dst;
  lVar35 = (long)conv_params->dst_stride;
  iVar43 = conv_params->do_average;
  iVar5 = conv_params->fwd_offset;
  iVar6 = conv_params->bck_offset;
  auVar85 = ZEXT416((uint)conv_params->round_1);
  iVar7 = conv_params->use_dist_wtd_comp_avg;
  iVar76 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
  auVar54._4_4_ = iVar36;
  auVar54._0_4_ = iVar36;
  auVar54._8_4_ = iVar36;
  auVar54._12_4_ = iVar36;
  auVar55 = pshuflw(auVar54,ZEXT416(uVar33),0);
  lVar38 = (long)src_stride;
  iVar32 = ((1 << ((byte)uVar34 & 0x1f)) >> 1) - iVar36;
  auVar95._4_4_ = uVar10;
  auVar95._0_4_ = uVar10;
  auVar95._8_4_ = uVar10;
  auVar95._12_4_ = uVar10;
  auVar59._4_4_ = uVar11;
  auVar59._0_4_ = uVar11;
  auVar59._8_4_ = uVar11;
  auVar59._12_4_ = uVar11;
  lVar45 = (long)dst_stride0;
  lVar44 = 0;
  for (lVar48 = 0; lVar48 < w; lVar48 = lVar48 + 8) {
    pauVar3 = (undefined1 (*) [16])(src + (lVar48 - lVar42));
    auVar77 = *pauVar3;
    puVar2 = (undefined2 *)(*pauVar3 + lVar38 * 2);
    auVar124 = *(undefined1 (*) [16])(*pauVar3 + (long)(src_stride * 2) * 2);
    auVar138 = *(undefined1 (*) [16])(*pauVar3 + (long)(src_stride * 3) * 2);
    auVar142 = *(undefined1 (*) [16])(*pauVar3 + (long)(src_stride * 4) * 2);
    auVar61 = *(undefined1 (*) [16])(*pauVar3 + (long)(src_stride * 5) * 2);
    auVar53 = *(undefined1 (*) [16])(*pauVar3 + (long)(src_stride * 6) * 2);
    auVar52._0_12_ = auVar77._0_12_;
    auVar52._12_2_ = auVar77._6_2_;
    auVar52._14_2_ = puVar2[3];
    auVar81._12_4_ = auVar52._12_4_;
    auVar81._0_10_ = auVar77._0_10_;
    auVar81._10_2_ = puVar2[2];
    auVar60._10_6_ = auVar81._10_6_;
    auVar60._0_8_ = auVar77._0_8_;
    auVar60._8_2_ = auVar77._4_2_;
    auVar56._8_8_ = auVar60._8_8_;
    auVar56._6_2_ = puVar2[1];
    auVar56._4_2_ = auVar77._2_2_;
    auVar56._0_2_ = auVar77._0_2_;
    auVar56._2_2_ = *puVar2;
    local_248._2_2_ = puVar2[4];
    local_248._0_2_ = auVar77._8_2_;
    local_248._4_2_ = auVar77._10_2_;
    local_248._6_2_ = puVar2[5];
    local_248._8_2_ = auVar77._12_2_;
    local_248._10_2_ = puVar2[6];
    local_248._12_2_ = auVar77._14_2_;
    local_248._14_2_ = puVar2[7];
    local_268._2_2_ = auVar124._0_2_;
    local_268._0_2_ = *puVar2;
    local_268._4_2_ = puVar2[1];
    local_268._6_2_ = auVar124._2_2_;
    local_268._8_2_ = puVar2[2];
    local_268._10_2_ = auVar124._4_2_;
    local_268._12_2_ = puVar2[3];
    local_268._14_2_ = auVar124._6_2_;
    local_1c8 = auVar124._8_2_;
    uStack_1c4 = auVar124._10_2_;
    uStack_1c0 = auVar124._12_2_;
    uStack_1bc = auVar124._14_2_;
    auVar137._0_12_ = auVar124._0_12_;
    auVar137._12_2_ = auVar124._6_2_;
    auVar137._14_2_ = auVar138._6_2_;
    auVar136._12_4_ = auVar137._12_4_;
    auVar136._0_10_ = auVar124._0_10_;
    auVar136._10_2_ = auVar138._4_2_;
    auVar135._10_6_ = auVar136._10_6_;
    auVar135._0_8_ = auVar124._0_8_;
    auVar135._8_2_ = auVar124._4_2_;
    auVar134._8_8_ = auVar135._8_8_;
    auVar134._6_2_ = auVar138._2_2_;
    auVar134._4_2_ = auVar124._2_2_;
    auVar134._2_2_ = auVar138._0_2_;
    auVar134._0_2_ = auVar124._0_2_;
    local_218 = auVar138._8_2_;
    uStack_214 = auVar138._10_2_;
    uStack_210 = auVar138._12_2_;
    uStack_20c = auVar138._14_2_;
    auVar118._0_12_ = auVar138._0_12_;
    auVar118._12_2_ = auVar138._6_2_;
    auVar118._14_2_ = auVar142._6_2_;
    auVar106._12_4_ = auVar118._12_4_;
    auVar106._0_10_ = auVar138._0_10_;
    auVar106._10_2_ = auVar142._4_2_;
    auVar147._10_6_ = auVar106._10_6_;
    auVar147._0_8_ = auVar138._0_8_;
    auVar147._8_2_ = auVar138._4_2_;
    auVar124._8_8_ = auVar147._8_8_;
    auVar124._6_2_ = auVar142._2_2_;
    auVar124._4_2_ = auVar138._2_2_;
    auVar124._2_2_ = auVar142._0_2_;
    auVar124._0_2_ = auVar138._0_2_;
    uStack_216 = auVar142._8_2_;
    uStack_212 = auVar142._10_2_;
    uStack_20e = auVar142._12_2_;
    uStack_20a = auVar142._14_2_;
    auVar141._0_12_ = auVar142._0_12_;
    auVar141._12_2_ = auVar142._6_2_;
    auVar141._14_2_ = auVar61._6_2_;
    auVar140._12_4_ = auVar141._12_4_;
    auVar140._0_10_ = auVar142._0_10_;
    auVar140._10_2_ = auVar61._4_2_;
    auVar139._10_6_ = auVar140._10_6_;
    auVar139._0_8_ = auVar142._0_8_;
    auVar139._8_2_ = auVar142._4_2_;
    auVar138._8_8_ = auVar139._8_8_;
    auVar138._6_2_ = auVar61._2_2_;
    auVar138._4_2_ = auVar142._2_2_;
    auVar138._2_2_ = auVar61._0_2_;
    auVar138._0_2_ = auVar142._0_2_;
    auVar125._0_12_ = auVar61._0_12_;
    auVar125._12_2_ = auVar61._6_2_;
    auVar125._14_2_ = auVar53._6_2_;
    auVar117._12_4_ = auVar125._12_4_;
    auVar117._0_10_ = auVar61._0_10_;
    auVar117._10_2_ = auVar53._4_2_;
    auVar74._10_6_ = auVar117._10_6_;
    auVar74._0_8_ = auVar61._0_8_;
    auVar74._8_2_ = auVar61._4_2_;
    auVar77._8_8_ = auVar74._8_8_;
    auVar77._6_2_ = auVar53._2_2_;
    auVar77._4_2_ = auVar61._2_2_;
    auVar77._2_2_ = auVar53._0_2_;
    auVar77._0_2_ = auVar61._0_2_;
    auVar142._2_2_ = auVar53._8_2_;
    auVar142._0_2_ = auVar61._8_2_;
    auVar142._4_2_ = auVar61._10_2_;
    auVar142._6_2_ = auVar53._10_2_;
    auVar142._8_2_ = auVar61._12_2_;
    auVar142._10_2_ = auVar53._12_2_;
    auVar142._12_2_ = auVar61._14_2_;
    auVar142._14_2_ = auVar53._14_2_;
    lVar37 = 0;
    pCVar39 = pCVar8;
    puVar40 = dst0;
    puVar41 = dst0 + lVar45;
    puVar47 = src + (src_stride * 7 - lVar42);
    puVar49 = src + (src_stride * 8 - lVar42);
    pCVar51 = pCVar8 + lVar35;
    uVar126 = puVar2[4];
    uVar127 = local_1c8;
    uVar128 = puVar2[5];
    uVar129 = uStack_1c4;
    uVar130 = puVar2[6];
    uVar131 = uStack_1c0;
    uVar132 = puVar2[7];
    uVar133 = uStack_1bc;
    local_208 = uStack_216;
    uStack_206 = auVar61._8_2_;
    uStack_204 = uStack_212;
    uStack_202 = auVar61._10_2_;
    uStack_200 = uStack_20e;
    uStack_1fe = auVar61._12_2_;
    uStack_1fc = uStack_20a;
    uStack_1fa = auVar61._14_2_;
    uStack_1c6 = local_218;
    uStack_1c2 = uStack_214;
    uStack_1be = uStack_210;
    uStack_1ba = uStack_20c;
    while( true ) {
      auVar52 = auVar124;
      auVar124 = auVar77;
      uVar31 = uStack_20a;
      uVar30 = uStack_20c;
      uVar29 = uStack_20e;
      uVar28 = uStack_210;
      uVar27 = uStack_212;
      uVar26 = uStack_214;
      uVar25 = uStack_216;
      uVar24 = local_218;
      auVar61._2_2_ = uStack_206;
      auVar61._0_2_ = local_208;
      auVar61._4_2_ = uStack_204;
      auVar61._6_2_ = uStack_202;
      auVar61._10_2_ = uStack_1fe;
      auVar61._8_2_ = uStack_200;
      auVar61._12_2_ = uStack_1fc;
      auVar61._14_2_ = uStack_1fa;
      if (h <= lVar37) break;
      auVar81 = *(undefined1 (*) [16])((long)puVar47 + lVar44);
      pauVar3 = (undefined1 (*) [16])((long)puVar49 + lVar44);
      auVar146._0_12_ = auVar53._0_12_;
      auVar146._12_2_ = auVar53._6_2_;
      auVar146._14_2_ = auVar81._6_2_;
      auVar145._12_4_ = auVar146._12_4_;
      auVar145._0_10_ = auVar53._0_10_;
      auVar145._10_2_ = auVar81._4_2_;
      auVar144._10_6_ = auVar145._10_6_;
      auVar144._0_8_ = auVar53._0_8_;
      auVar144._8_2_ = auVar53._4_2_;
      auVar143._8_8_ = auVar144._8_8_;
      auVar143._6_2_ = auVar81._2_2_;
      auVar143._4_2_ = auVar53._2_2_;
      auVar143._0_2_ = auVar53._0_2_;
      auVar143._2_2_ = auVar81._0_2_;
      uVar68 = auVar53._8_2_;
      uVar110 = auVar81._8_2_;
      uVar70 = auVar53._10_2_;
      uVar112 = auVar81._10_2_;
      uVar71 = auVar53._12_2_;
      uVar113 = auVar81._12_2_;
      uVar73 = auVar53._14_2_;
      uVar115 = auVar81._14_2_;
      auVar53 = pmaddwd(auVar56,auVar95);
      auVar60 = pmaddwd(auVar134,auVar59);
      auVar21._4_4_ = uVar12;
      auVar21._0_4_ = uVar12;
      auVar21._8_4_ = uVar12;
      auVar21._12_4_ = uVar12;
      auVar74 = pmaddwd(auVar138,auVar21);
      auVar20._4_4_ = uVar13;
      auVar20._0_4_ = uVar13;
      auVar20._8_4_ = uVar13;
      auVar20._12_4_ = uVar13;
      auVar147 = pmaddwd(auVar143,auVar20);
      auVar80._0_12_ = auVar81._0_12_;
      auVar80._12_2_ = auVar81._6_2_;
      auVar80._14_2_ = *(undefined2 *)(*pauVar3 + 6);
      auVar79._12_4_ = auVar80._12_4_;
      auVar79._0_10_ = auVar81._0_10_;
      auVar79._10_2_ = *(undefined2 *)(*pauVar3 + 4);
      auVar78._10_6_ = auVar79._10_6_;
      auVar78._0_8_ = auVar81._0_8_;
      auVar78._8_2_ = auVar81._4_2_;
      auVar77._8_8_ = auVar78._8_8_;
      auVar77._6_2_ = *(undefined2 *)(*pauVar3 + 2);
      auVar77._4_2_ = auVar81._2_2_;
      auVar77._2_2_ = *(undefined2 *)*pauVar3;
      auVar77._0_2_ = auVar81._0_2_;
      auVar22._4_4_ = iVar76;
      auVar22._0_4_ = iVar76;
      auVar22._8_4_ = iVar76;
      auVar22._12_4_ = iVar76;
      auVar117 = pmaddwd(local_268,auVar95);
      auVar125 = pmaddwd(auVar52,auVar59);
      auVar56 = pmaddwd(auVar124,auVar21);
      auVar81 = pmaddwd(auVar77,auVar20);
      auVar105._2_2_ = *(undefined2 *)(*pauVar3 + 8);
      auVar105._0_2_ = uVar110;
      auVar105._4_2_ = uVar112;
      auVar105._6_2_ = *(undefined2 *)(*pauVar3 + 10);
      auVar105._8_2_ = uVar113;
      auVar105._10_2_ = *(undefined2 *)(*pauVar3 + 0xc);
      auVar105._12_2_ = uVar115;
      auVar105._14_2_ = *(undefined2 *)(*pauVar3 + 0xe);
      auVar148._0_4_ =
           ((auVar147._0_4_ + auVar74._0_4_ + auVar60._0_4_ + auVar53._0_4_ << iVar50) + iVar76 >>
           auVar85) + iVar36;
      auVar148._4_4_ =
           (auVar147._4_4_ + auVar74._4_4_ + auVar60._4_4_ + auVar53._4_4_ + iVar76 >> auVar85) +
           iVar36;
      auVar148._8_4_ =
           (auVar147._8_4_ + auVar74._8_4_ + auVar60._8_4_ + auVar53._8_4_ + iVar76 >> auVar85) +
           iVar36;
      auVar148._12_4_ =
           (auVar147._12_4_ + auVar74._12_4_ + auVar60._12_4_ + auVar53._12_4_ + iVar76 >> auVar85)
           + iVar36;
      auVar82._0_4_ =
           ((auVar81._0_4_ + auVar56._0_4_ + auVar125._0_4_ + auVar117._0_4_ << iVar50) + iVar76 >>
           auVar85) + iVar36;
      auVar82._4_4_ =
           (auVar81._4_4_ + auVar56._4_4_ + auVar125._4_4_ + auVar117._4_4_ + iVar76 >> auVar85) +
           iVar36;
      auVar82._8_4_ =
           (auVar81._8_4_ + auVar56._8_4_ + auVar125._8_4_ + auVar117._8_4_ + iVar76 >> auVar85) +
           iVar36;
      auVar82._12_4_ =
           (auVar81._12_4_ + auVar56._12_4_ + auVar125._12_4_ + auVar117._12_4_ + iVar76 >> auVar85)
           + iVar36;
      auVar53._4_4_ = iVar6;
      auVar53._0_4_ = iVar6;
      auVar53._8_4_ = iVar6;
      auVar53._12_4_ = iVar6;
      auVar81 = pmulld(auVar148,auVar53);
      auVar56 = pmulld(auVar82,auVar53);
      auVar53 = ZEXT416(uVar34);
      local_128 = auVar55._0_2_;
      sStack_126 = auVar55._2_2_;
      if ((long)w + -8 < lVar48) {
        if (iVar43 == 0) {
          auVar53 = packusdw(auVar148,auVar148);
          auVar61 = packusdw(auVar82,auVar82);
          *(long *)((long)pCVar39 + lVar44) = auVar53._0_8_;
          *(long *)((long)pCVar51 + lVar44) = auVar61._0_8_;
        }
        else {
          auVar60 = pmovzxwd(auVar54,*(undefined8 *)((long)pCVar39 + lVar44));
          auVar61 = pmovzxwd(auVar22,*(undefined8 *)((long)pCVar51 + lVar44));
          if (iVar7 == 0) {
            iVar84 = auVar148._0_4_ + auVar60._0_4_ >> 1;
            iVar90 = auVar148._4_4_ + auVar60._4_4_ >> 1;
            iVar92 = auVar148._8_4_ + auVar60._8_4_ >> 1;
            iVar93 = auVar148._12_4_ + auVar60._12_4_ >> 1;
            iVar58 = auVar82._0_4_ + auVar61._0_4_ >> 1;
            iVar66 = auVar82._4_4_ + auVar61._4_4_ >> 1;
            iVar69 = auVar82._8_4_ + auVar61._8_4_ >> 1;
            iVar72 = auVar82._12_4_ + auVar61._12_4_ >> 1;
          }
          else {
            auVar17._4_4_ = iVar5;
            auVar17._0_4_ = iVar5;
            auVar17._8_4_ = iVar5;
            auVar17._12_4_ = iVar5;
            auVar60 = pmulld(auVar60,auVar17);
            iVar84 = auVar60._0_4_ + auVar81._0_4_ >> 4;
            iVar90 = auVar60._4_4_ + auVar81._4_4_ >> 4;
            iVar92 = auVar60._8_4_ + auVar81._8_4_ >> 4;
            iVar93 = auVar60._12_4_ + auVar81._12_4_ >> 4;
            auVar61 = pmulld(auVar61,auVar17);
            iVar58 = auVar61._0_4_ + auVar56._0_4_ >> 4;
            iVar66 = auVar61._4_4_ + auVar56._4_4_ >> 4;
            iVar69 = auVar61._8_4_ + auVar56._8_4_ >> 4;
            iVar72 = auVar61._12_4_ + auVar56._12_4_ >> 4;
          }
          auVar86._0_4_ = iVar84 + iVar32 >> auVar53;
          auVar86._4_4_ = iVar90 + iVar32 >> auVar53;
          auVar86._8_4_ = iVar92 + iVar32 >> auVar53;
          auVar86._12_4_ = iVar93 + iVar32 >> auVar53;
          auVar63._0_4_ = iVar58 + iVar32 >> auVar53;
          auVar63._4_4_ = iVar66 + iVar32 >> auVar53;
          auVar63._8_4_ = iVar69 + iVar32 >> auVar53;
          auVar63._12_4_ = iVar72 + iVar32 >> auVar53;
          auVar61 = packusdw(auVar86,auVar86);
          sVar83 = auVar61._0_2_;
          sVar88 = auVar61._2_2_;
          sVar89 = auVar61._4_2_;
          sVar91 = auVar61._6_2_;
          auVar61 = packusdw(auVar63,auVar63);
          sVar57 = auVar61._0_2_;
          sVar64 = auVar61._2_2_;
          sVar65 = auVar61._4_2_;
          sVar67 = auVar61._6_2_;
          *(ulong *)((long)puVar40 + lVar44) =
               CONCAT26((ushort)(sStack_126 < sVar91) * sStack_126 |
                        (ushort)(sStack_126 >= sVar91) * sVar91,
                        CONCAT24((ushort)(local_128 < sVar89) * local_128 |
                                 (ushort)(local_128 >= sVar89) * sVar89,
                                 CONCAT22((ushort)(sStack_126 < sVar88) * sStack_126 |
                                          (ushort)(sStack_126 >= sVar88) * sVar88,
                                          (ushort)(local_128 < sVar83) * local_128 |
                                          (ushort)(local_128 >= sVar83) * sVar83)));
          *(ulong *)((long)puVar41 + lVar44) =
               CONCAT26((ushort)(sStack_126 < sVar67) * sStack_126 |
                        (ushort)(sStack_126 >= sVar67) * sVar67,
                        CONCAT24((ushort)(local_128 < sVar65) * local_128 |
                                 (ushort)(local_128 >= sVar65) * sVar65,
                                 CONCAT22((ushort)(sStack_126 < sVar64) * sStack_126 |
                                          (ushort)(sStack_126 >= sVar64) * sVar64,
                                          (ushort)(local_128 < sVar57) * local_128 |
                                          (ushort)(local_128 >= sVar57) * sVar57)));
        }
      }
      else {
        auVar74 = pmaddwd(local_248,auVar95);
        auVar16._2_2_ = uStack_1c6;
        auVar16._0_2_ = local_1c8;
        auVar16._4_2_ = uStack_1c4;
        auVar16._6_2_ = uStack_1c2;
        auVar16._8_2_ = uStack_1c0;
        auVar16._10_2_ = uStack_1be;
        auVar16._12_2_ = uStack_1bc;
        auVar16._14_2_ = uStack_1ba;
        auVar60 = pmaddwd(auVar16,auVar59);
        auVar117 = pmaddwd(auVar61,auVar21);
        auVar15._2_2_ = uVar110;
        auVar15._0_2_ = uVar68;
        auVar15._4_2_ = uVar70;
        auVar15._6_2_ = uVar112;
        auVar15._8_2_ = uVar71;
        auVar15._10_2_ = uVar113;
        auVar15._12_2_ = uVar73;
        auVar15._14_2_ = uVar115;
        auVar118 = pmaddwd(auVar15,auVar20);
        auVar23._2_2_ = uVar127;
        auVar23._0_2_ = uVar126;
        auVar23._4_2_ = uVar128;
        auVar23._6_2_ = uVar129;
        auVar23._8_2_ = uVar130;
        auVar23._10_2_ = uVar131;
        auVar23._12_2_ = uVar132;
        auVar23._14_2_ = uVar133;
        auVar125 = pmaddwd(auVar23,auVar95);
        auVar14._2_2_ = uStack_216;
        auVar14._0_2_ = local_218;
        auVar14._4_2_ = uStack_214;
        auVar14._6_2_ = uStack_212;
        auVar14._8_2_ = uStack_210;
        auVar14._10_2_ = uStack_20e;
        auVar14._12_2_ = uStack_20c;
        auVar14._14_2_ = uStack_20a;
        auVar61 = pmaddwd(auVar14,auVar59);
        auVar147 = pmaddwd(auVar142,auVar21);
        auVar106 = pmaddwd(auVar105,auVar20);
        auVar119._0_4_ =
             ((auVar118._0_4_ + auVar117._0_4_ + auVar60._0_4_ + auVar74._0_4_ << iVar50) + iVar76
             >> auVar85) + iVar36;
        auVar119._4_4_ =
             (auVar118._4_4_ + auVar117._4_4_ + auVar60._4_4_ + auVar74._4_4_ + iVar76 >> auVar85) +
             iVar36;
        auVar119._8_4_ =
             (auVar118._8_4_ + auVar117._8_4_ + auVar60._8_4_ + auVar74._8_4_ + iVar76 >> auVar85) +
             iVar36;
        auVar119._12_4_ =
             (auVar118._12_4_ + auVar117._12_4_ + auVar60._12_4_ + auVar74._12_4_ + iVar76 >>
             auVar85) + iVar36;
        auVar107._0_4_ =
             ((auVar106._0_4_ + auVar147._0_4_ + auVar61._0_4_ + auVar125._0_4_ << iVar50) + iVar76
             >> auVar85) + iVar36;
        auVar107._4_4_ =
             (auVar106._4_4_ + auVar147._4_4_ + auVar61._4_4_ + auVar125._4_4_ + iVar76 >> auVar85)
             + iVar36;
        auVar107._8_4_ =
             (auVar106._8_4_ + auVar147._8_4_ + auVar61._8_4_ + auVar125._8_4_ + iVar76 >> auVar85)
             + iVar36;
        auVar107._12_4_ =
             (auVar106._12_4_ + auVar147._12_4_ + auVar61._12_4_ + auVar125._12_4_ + iVar76 >>
             auVar85) + iVar36;
        if (iVar43 == 0) {
          auVar53 = packusdw(auVar148,auVar119);
          auVar61 = packusdw(auVar82,auVar107);
          *(undefined1 (*) [16])((long)pCVar39 + lVar44) = auVar53;
          *(undefined1 (*) [16])((long)pCVar51 + lVar44) = auVar61;
        }
        else {
          auVar61 = *(undefined1 (*) [16])((long)pCVar39 + lVar44);
          auVar60 = *(undefined1 (*) [16])((long)pCVar51 + lVar44);
          auVar74 = pmovzxwd(auVar54,auVar61);
          auVar117 = pmovzxwd(auVar95,auVar60);
          auVar75._0_4_ = CONCAT22(0,auVar61._8_2_);
          auVar75._4_2_ = auVar61._10_2_;
          auVar75._6_2_ = 0;
          auVar75._8_2_ = auVar61._12_2_;
          auVar75._10_2_ = 0;
          auVar75._12_2_ = auVar61._14_2_;
          auVar75._14_2_ = 0;
          auVar62._0_4_ = CONCAT22(0,auVar60._8_2_);
          auVar62._4_2_ = auVar60._10_2_;
          auVar62._6_2_ = 0;
          auVar62._8_2_ = auVar60._12_2_;
          auVar62._10_2_ = 0;
          auVar62._12_2_ = auVar60._14_2_;
          auVar62._14_2_ = 0;
          if (iVar7 == 0) {
            iVar84 = auVar148._0_4_ + auVar74._0_4_ >> 1;
            iVar90 = auVar148._4_4_ + auVar74._4_4_ >> 1;
            iVar92 = auVar148._8_4_ + auVar74._8_4_ >> 1;
            iVar93 = auVar148._12_4_ + auVar74._12_4_ >> 1;
            iVar58 = auVar82._0_4_ + auVar117._0_4_ >> 1;
            iVar66 = auVar82._4_4_ + auVar117._4_4_ >> 1;
            iVar69 = auVar82._8_4_ + auVar117._8_4_ >> 1;
            iVar72 = auVar82._12_4_ + auVar117._12_4_ >> 1;
            iVar116 = (int)(auVar119._0_4_ + auVar75._0_4_) >> 1;
            iVar121 = (int)(auVar119._4_4_ + (uint)auVar61._10_2_) >> 1;
            iVar122 = (int)(auVar119._8_4_ + (uint)auVar61._12_2_) >> 1;
            iVar123 = (int)(auVar119._12_4_ + (uint)auVar61._14_2_) >> 1;
            iVar104 = (int)(auVar107._0_4_ + auVar62._0_4_) >> 1;
            iVar109 = (int)(auVar107._4_4_ + (uint)auVar60._10_2_) >> 1;
            iVar111 = (int)(auVar107._8_4_ + (uint)auVar60._12_2_) >> 1;
            iVar114 = (int)(auVar107._12_4_ + (uint)auVar60._14_2_) >> 1;
          }
          else {
            auVar18._4_4_ = iVar5;
            auVar18._0_4_ = iVar5;
            auVar18._8_4_ = iVar5;
            auVar18._12_4_ = iVar5;
            auVar61 = pmulld(auVar74,auVar18);
            iVar84 = auVar61._0_4_ + auVar81._0_4_ >> 4;
            iVar90 = auVar61._4_4_ + auVar81._4_4_ >> 4;
            iVar92 = auVar61._8_4_ + auVar81._8_4_ >> 4;
            iVar93 = auVar61._12_4_ + auVar81._12_4_ >> 4;
            auVar61 = pmulld(auVar117,auVar18);
            iVar58 = auVar61._0_4_ + auVar56._0_4_ >> 4;
            iVar66 = auVar61._4_4_ + auVar56._4_4_ >> 4;
            iVar69 = auVar61._8_4_ + auVar56._8_4_ >> 4;
            iVar72 = auVar61._12_4_ + auVar56._12_4_ >> 4;
            auVar61 = pmulld(auVar75,auVar18);
            auVar19._4_4_ = iVar6;
            auVar19._0_4_ = iVar6;
            auVar19._8_4_ = iVar6;
            auVar19._12_4_ = iVar6;
            auVar56 = pmulld(auVar119,auVar19);
            iVar116 = auVar56._0_4_ + auVar61._0_4_ >> 4;
            iVar121 = auVar56._4_4_ + auVar61._4_4_ >> 4;
            iVar122 = auVar56._8_4_ + auVar61._8_4_ >> 4;
            iVar123 = auVar56._12_4_ + auVar61._12_4_ >> 4;
            auVar61 = pmulld(auVar62,auVar18);
            auVar56 = pmulld(auVar107,auVar19);
            iVar104 = auVar56._0_4_ + auVar61._0_4_ >> 4;
            iVar109 = auVar56._4_4_ + auVar61._4_4_ >> 4;
            iVar111 = auVar56._8_4_ + auVar61._8_4_ >> 4;
            iVar114 = auVar56._12_4_ + auVar61._12_4_ >> 4;
          }
          auVar87._0_4_ = iVar84 + iVar32 >> auVar53;
          auVar87._4_4_ = iVar90 + iVar32 >> auVar53;
          auVar87._8_4_ = iVar92 + iVar32 >> auVar53;
          auVar87._12_4_ = iVar93 + iVar32 >> auVar53;
          auVar96._0_4_ = iVar58 + iVar32 >> auVar53;
          auVar96._4_4_ = iVar66 + iVar32 >> auVar53;
          auVar96._8_4_ = iVar69 + iVar32 >> auVar53;
          auVar96._12_4_ = iVar72 + iVar32 >> auVar53;
          auVar120._0_4_ = iVar116 + iVar32 >> auVar53;
          auVar120._4_4_ = iVar121 + iVar32 >> auVar53;
          auVar120._8_4_ = iVar122 + iVar32 >> auVar53;
          auVar120._12_4_ = iVar123 + iVar32 >> auVar53;
          auVar61 = packusdw(auVar87,auVar120);
          auVar108._0_4_ = iVar104 + iVar32 >> auVar53;
          auVar108._4_4_ = iVar109 + iVar32 >> auVar53;
          auVar108._8_4_ = iVar111 + iVar32 >> auVar53;
          auVar108._12_4_ = iVar114 + iVar32 >> auVar53;
          auVar53 = packusdw(auVar96,auVar108);
          sVar57 = auVar61._0_2_;
          sVar64 = auVar61._2_2_;
          sVar65 = auVar61._4_2_;
          sVar67 = auVar61._6_2_;
          sVar83 = auVar61._8_2_;
          sVar88 = auVar61._10_2_;
          sVar89 = auVar61._12_2_;
          sVar91 = auVar61._14_2_;
          sVar94 = auVar53._0_2_;
          sVar97 = auVar53._2_2_;
          sVar98 = auVar53._4_2_;
          sVar99 = auVar53._6_2_;
          sVar100 = auVar53._8_2_;
          sVar101 = auVar53._10_2_;
          sVar102 = auVar53._12_2_;
          sVar103 = auVar53._14_2_;
          puVar4 = (ushort *)((long)puVar40 + lVar44);
          *puVar4 = (ushort)(local_128 < sVar57) * local_128 |
                    (ushort)(local_128 >= sVar57) * sVar57;
          puVar4[1] = (ushort)(sStack_126 < sVar64) * sStack_126 |
                      (ushort)(sStack_126 >= sVar64) * sVar64;
          puVar4[2] = (ushort)(local_128 < sVar65) * local_128 |
                      (ushort)(local_128 >= sVar65) * sVar65;
          puVar4[3] = (ushort)(sStack_126 < sVar67) * sStack_126 |
                      (ushort)(sStack_126 >= sVar67) * sVar67;
          puVar4[4] = (ushort)(local_128 < sVar83) * local_128 |
                      (ushort)(local_128 >= sVar83) * sVar83;
          puVar4[5] = (ushort)(sStack_126 < sVar88) * sStack_126 |
                      (ushort)(sStack_126 >= sVar88) * sVar88;
          puVar4[6] = (ushort)(local_128 < sVar89) * local_128 |
                      (ushort)(local_128 >= sVar89) * sVar89;
          puVar4[7] = (ushort)(sStack_126 < sVar91) * sStack_126 |
                      (ushort)(sStack_126 >= sVar91) * sVar91;
          puVar4 = (ushort *)((long)puVar41 + lVar44);
          *puVar4 = (ushort)(local_128 < sVar94) * local_128 |
                    (ushort)(local_128 >= sVar94) * sVar94;
          puVar4[1] = (ushort)(sStack_126 < sVar97) * sStack_126 |
                      (ushort)(sStack_126 >= sVar97) * sVar97;
          puVar4[2] = (ushort)(local_128 < sVar98) * local_128 |
                      (ushort)(local_128 >= sVar98) * sVar98;
          puVar4[3] = (ushort)(sStack_126 < sVar99) * sStack_126 |
                      (ushort)(sStack_126 >= sVar99) * sVar99;
          puVar4[4] = (ushort)(local_128 < sVar100) * local_128 |
                      (ushort)(local_128 >= sVar100) * sVar100;
          puVar4[5] = (ushort)(sStack_126 < sVar101) * sStack_126 |
                      (ushort)(sStack_126 >= sVar101) * sVar101;
          puVar4[6] = (ushort)(local_128 < sVar102) * local_128 |
                      (ushort)(local_128 >= sVar102) * sVar102;
          puVar4[7] = (ushort)(sStack_126 < sVar103) * sStack_126 |
                      (ushort)(sStack_126 >= sVar103) * sVar103;
        }
      }
      auVar53 = *pauVar3;
      lVar37 = lVar37 + 2;
      puVar49 = puVar49 + lVar38 * 2;
      puVar47 = puVar47 + lVar38 * 2;
      pCVar51 = pCVar51 + lVar35 * 2;
      pCVar39 = pCVar39 + lVar35 * 2;
      puVar41 = puVar41 + lVar45 * 2;
      puVar40 = puVar40 + lVar45 * 2;
      local_248._2_2_ = uStack_1c6;
      local_248._0_2_ = local_1c8;
      local_248._4_2_ = uStack_1c4;
      local_248._6_2_ = uStack_1c2;
      local_248._10_2_ = uStack_1be;
      local_248._8_2_ = uStack_1c0;
      local_248._12_2_ = uStack_1bc;
      local_248._14_2_ = uStack_1ba;
      local_1c8 = local_208;
      uStack_1c6 = uStack_206;
      uStack_1c4 = uStack_204;
      uStack_1c2 = uStack_202;
      uStack_1c0 = uStack_200;
      uStack_1be = uStack_1fe;
      uStack_1bc = uStack_1fc;
      uStack_1ba = uStack_1fa;
      local_218 = auVar142._0_2_;
      uStack_216 = auVar142._2_2_;
      uStack_214 = auVar142._4_2_;
      uStack_212 = auVar142._6_2_;
      uStack_210 = auVar142._8_2_;
      uStack_20e = auVar142._10_2_;
      uStack_20c = auVar142._12_2_;
      uStack_20a = auVar142._14_2_;
      auVar56 = auVar134;
      auVar134 = auVar138;
      auVar138 = auVar143;
      auVar142 = auVar105;
      uVar126 = uVar24;
      uVar127 = uVar25;
      uVar128 = uVar26;
      uVar129 = uVar27;
      uVar130 = uVar28;
      uVar131 = uVar29;
      uVar132 = uVar30;
      uVar133 = uVar31;
      local_268 = auVar52;
      local_208 = uVar68;
      uStack_206 = uVar110;
      uStack_204 = uVar70;
      uStack_202 = uVar112;
      uStack_200 = uVar71;
      uStack_1fe = uVar113;
      uStack_1fc = uVar73;
      uStack_1fa = uVar115;
    }
    lVar44 = lVar44 + 0x10;
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  int i, j;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i round_const_y =
      _mm_set1_epi32(((1 << conv_params->round_1) >> 1));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();
  __m128i s[16], coeffs_y[4];

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
      __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
      __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
      __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
      __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
      __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
      __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));

      s[0] = _mm_unpacklo_epi16(s0, s1);
      s[1] = _mm_unpacklo_epi16(s2, s3);
      s[2] = _mm_unpacklo_epi16(s4, s5);

      s[4] = _mm_unpackhi_epi16(s0, s1);
      s[5] = _mm_unpackhi_epi16(s2, s3);
      s[6] = _mm_unpackhi_epi16(s4, s5);

      s[0 + 8] = _mm_unpacklo_epi16(s1, s2);
      s[1 + 8] = _mm_unpacklo_epi16(s3, s4);
      s[2 + 8] = _mm_unpacklo_epi16(s5, s6);

      s[4 + 8] = _mm_unpackhi_epi16(s1, s2);
      s[5 + 8] = _mm_unpackhi_epi16(s3, s4);
      s[6 + 8] = _mm_unpackhi_epi16(s5, s6);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
        __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));

        s[3] = _mm_unpacklo_epi16(s6, s7);
        s[7] = _mm_unpackhi_epi16(s6, s7);

        s[3 + 8] = _mm_unpacklo_epi16(s7, s8);
        s[7 + 8] = _mm_unpackhi_epi16(s7, s8);

        const __m128i res_a0 = convolve(s, coeffs_y);
        __m128i res_a_round0 = _mm_sll_epi32(res_a0, round_shift_bits);
        res_a_round0 = _mm_sra_epi32(_mm_add_epi32(res_a_round0, round_const_y),
                                     round_shift_y);

        const __m128i res_a1 = convolve(s + 8, coeffs_y);
        __m128i res_a_round1 = _mm_sll_epi32(res_a1, round_shift_bits);
        res_a_round1 = _mm_sra_epi32(_mm_add_epi32(res_a_round1, round_const_y),
                                     round_shift_y);

        __m128i res_unsigned_lo_0 = _mm_add_epi32(res_a_round0, offset_const);
        __m128i res_unsigned_lo_1 = _mm_add_epi32(res_a_round1, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m128i data_0 =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_1 = _mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride]));

            const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);
            const __m128i data_ref_1 = _mm_unpacklo_epi16(data_1, zero);

            const __m128i comp_avg_res_0 =
                highbd_comp_avg_sse4_1(&data_ref_0, &res_unsigned_lo_0, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_1 =
                highbd_comp_avg_sse4_1(&data_ref_1, &res_unsigned_lo_1, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_1, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b_0 =
                _mm_packus_epi32(round_result_0, round_result_0);
            const __m128i res_clip_0 =
                _mm_min_epi16(res_16b_0, clip_pixel_to_bd);
            const __m128i res_16b_1 =
                _mm_packus_epi32(round_result_1, round_result_1);
            const __m128i res_clip_1 =
                _mm_min_epi16(res_16b_1, clip_pixel_to_bd);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]),
                             res_clip_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                res_clip_1);

          } else {
            __m128i res_16b_0 =
                _mm_packus_epi32(res_unsigned_lo_0, res_unsigned_lo_0);

            __m128i res_16b_1 =
                _mm_packus_epi32(res_unsigned_lo_1, res_unsigned_lo_1);

            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_16b_0);
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_16b_1);
          }
        } else {
          const __m128i res_b0 = convolve(s + 4, coeffs_y);
          __m128i res_b_round0 = _mm_sll_epi32(res_b0, round_shift_bits);
          res_b_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_b_round0, round_const_y), round_shift_y);

          const __m128i res_b1 = convolve(s + 4 + 8, coeffs_y);
          __m128i res_b_round1 = _mm_sll_epi32(res_b1, round_shift_bits);
          res_b_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_b_round1, round_const_y), round_shift_y);

          __m128i res_unsigned_hi_0 = _mm_add_epi32(res_b_round0, offset_const);
          __m128i res_unsigned_hi_1 = _mm_add_epi32(res_b_round1, offset_const);

          if (do_average) {
            const __m128i data_0 =
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_1 = _mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride]));
            const __m128i data_ref_0_lo_0 = _mm_unpacklo_epi16(data_0, zero);
            const __m128i data_ref_0_lo_1 = _mm_unpacklo_epi16(data_1, zero);

            const __m128i data_ref_0_hi_0 = _mm_unpackhi_epi16(data_0, zero);
            const __m128i data_ref_0_hi_1 = _mm_unpackhi_epi16(data_1, zero);

            const __m128i comp_avg_res_lo_0 =
                highbd_comp_avg_sse4_1(&data_ref_0_lo_0, &res_unsigned_lo_0,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_lo_1 =
                highbd_comp_avg_sse4_1(&data_ref_0_lo_1, &res_unsigned_lo_1,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi_0 =
                highbd_comp_avg_sse4_1(&data_ref_0_hi_0, &res_unsigned_hi_0,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi_1 =
                highbd_comp_avg_sse4_1(&data_ref_0_hi_1, &res_unsigned_hi_1,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_lo_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_lo_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo_1, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi_1, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b_0 =
                _mm_packus_epi32(round_result_lo_0, round_result_hi_0);
            const __m128i res_clip_0 =
                _mm_min_epi16(res_16b_0, clip_pixel_to_bd);

            const __m128i res_16b_1 =
                _mm_packus_epi32(round_result_lo_1, round_result_hi_1);
            const __m128i res_clip_1 =
                _mm_min_epi16(res_16b_1, clip_pixel_to_bd);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]),
                            res_clip_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                res_clip_1);
          } else {
            __m128i res_16bit0 =
                _mm_packus_epi32(res_unsigned_lo_0, res_unsigned_hi_0);
            __m128i res_16bit1 =
                _mm_packus_epi32(res_unsigned_lo_1, res_unsigned_hi_1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16bit0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_16bit1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];

        s[0 + 8] = s[1 + 8];
        s[1 + 8] = s[2 + 8];
        s[2 + 8] = s[3 + 8];

        s[4 + 8] = s[5 + 8];
        s[5 + 8] = s[6 + 8];
        s[6 + 8] = s[7 + 8];

        s6 = s8;
      }
    }
  }
}